

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O3

UMutableCPTrie * umutablecptrie_clone_63(UMutableCPTrie *other,UErrorCode *pErrorCode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  MutableCodePointTrie *this;
  uint32_t *puVar4;
  uint32_t *puVar5;
  UErrorCode *__src;
  MutableCodePointTrie *pMVar6;
  uint uVar7;
  
  if (other == (UMutableCPTrie *)0x0) {
    return (UMutableCPTrie *)0x0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  __src = pErrorCode;
  this = (MutableCodePointTrie *)
         icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
  if (this == (MutableCodePointTrie *)0x0) {
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    pMVar6 = (MutableCodePointTrie *)0x0;
LAB_002e5a32:
    this = (MutableCodePointTrie *)0x0;
  }
  else {
    this->index = (uint32_t *)0x0;
    this->indexCapacity = 0;
    this->index3NullOffset = *(int32_t *)(other + 0xc);
    this->data = (uint32_t *)0x0;
    this->dataCapacity = 0;
    this->dataLength = 0;
    uVar1 = *(undefined8 *)(other + 0x20);
    uVar2 = *(undefined8 *)(other + 0x28);
    this->dataNullOffset = (int)uVar1;
    this->origInitialValue = (int)((ulong)uVar1 >> 0x20);
    this->initialValue = (int)uVar2;
    this->errorValue = (int)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined8 *)(other + 0x30);
    this->highStart = (int)uVar1;
    this->highValue = (int)((ulong)uVar1 >> 0x20);
    this->index16 = (uint16_t *)0x0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar7 = (uint)(0x10000 < (int)uVar1);
      puVar4 = (uint32_t *)uprv_malloc_63((ulong)(uVar7 * 0x40000 + 0x4000));
      this->index = puVar4;
      puVar5 = (uint32_t *)uprv_malloc_63((long)*(int *)(other + 0x18) << 2);
      this->data = puVar5;
      puVar4 = this->index;
      if ((puVar4 == (uint32_t *)0x0) || (puVar5 == (uint32_t *)0x0)) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        this->indexCapacity = uVar7 * 0x10000 | 0x1000;
        this->dataCapacity = *(int32_t *)(other + 0x18);
        iVar3 = this->highStart >> 4;
        memcpy(this->flags,other + 0x40,(long)iVar3);
        memcpy(puVar4,*(void **)other,(long)(iVar3 << 2));
        __src = *(UErrorCode **)(other + 0x10);
        memcpy(this->data,__src,(long)*(int *)(other + 0x1c) << 2);
        this->dataLength = *(int32_t *)(other + 0x1c);
        pMVar6 = this;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002e5a32;
      }
    }
    icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(this);
    pMVar6 = (MutableCodePointTrie *)0x0;
  }
  icu_63::UMemory::operator_delete((UMemory *)this,__src);
  return (UMutableCPTrie *)pMVar6;
}

Assistant:

U_CAPI UMutableCPTrie * U_EXPORT2
umutablecptrie_clone(const UMutableCPTrie *other, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    if (other == nullptr) {
        return nullptr;
    }
    LocalPointer<MutableCodePointTrie> clone(
        new MutableCodePointTrie(*reinterpret_cast<const MutableCodePointTrie *>(other), *pErrorCode), *pErrorCode);
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    return reinterpret_cast<UMutableCPTrie *>(clone.orphan());
}